

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O0

int I444Scale_16(uint16_t *src_y,int src_stride_y,uint16_t *src_u,int src_stride_u,uint16_t *src_v,
                int src_stride_v,int src_width,int src_height,uint16_t *dst_y,int dst_stride_y,
                uint16_t *dst_u,int dst_stride_u,uint16_t *dst_v,int dst_stride_v,int dst_width,
                int dst_height,FilterMode filtering)

{
  int in_ECX;
  uint16_t *in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  undefined4 in_stack_0000001c;
  FilterMode in_stack_00000020;
  int in_stack_00000050;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (((((in_RDI == 0) || (in_RDX == (uint16_t *)0x0)) || (in_R8 == 0)) ||
      ((((in_stack_00000008 == 0 || (in_stack_00000010 == 0)) ||
        ((0x8000 < in_stack_00000008 ||
         ((0x8000 < in_stack_00000010 || (CONCAT44(in_stack_0000001c,in_stack_00000018) == 0))))))
       || (src_v == (uint16_t *)0x0)))) ||
     (((src_u == (uint16_t *)0x0 || ((int)src_y < 1)) || (in_stack_00000050 < 1)))) {
    iVar1 = -1;
  }
  else {
    ScalePlane_16((uint16_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                  (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI,in_RDX,in_ECX,in_stack_00000010,
                  in_stack_00000018,in_stack_00000020);
    ScalePlane_16((uint16_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                  (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI,in_RDX,in_ECX,in_stack_00000010,
                  in_stack_00000018,in_stack_00000020);
    ScalePlane_16((uint16_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                  (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI,in_RDX,in_ECX,in_stack_00000010,
                  in_stack_00000018,in_stack_00000020);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int I444Scale_16(const uint16_t* src_y,
                 int src_stride_y,
                 const uint16_t* src_u,
                 int src_stride_u,
                 const uint16_t* src_v,
                 int src_stride_v,
                 int src_width,
                 int src_height,
                 uint16_t* dst_y,
                 int dst_stride_y,
                 uint16_t* dst_u,
                 int dst_stride_u,
                 uint16_t* dst_v,
                 int dst_stride_v,
                 int dst_width,
                 int dst_height,
                 enum FilterMode filtering) {
  if (!src_y || !src_u || !src_v || src_width == 0 || src_height == 0 ||
      src_width > 32768 || src_height > 32768 || !dst_y || !dst_u || !dst_v ||
      dst_width <= 0 || dst_height <= 0) {
    return -1;
  }

  ScalePlane_16(src_y, src_stride_y, src_width, src_height, dst_y, dst_stride_y,
                dst_width, dst_height, filtering);
  ScalePlane_16(src_u, src_stride_u, src_width, src_height, dst_u, dst_stride_u,
                dst_width, dst_height, filtering);
  ScalePlane_16(src_v, src_stride_v, src_width, src_height, dst_v, dst_stride_v,
                dst_width, dst_height, filtering);
  return 0;
}